

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O2

HdlcByte * __thiscall
HdlcAnalyzer::ByteAsyncReadByte(HdlcByte *__return_storage_ptr__,HdlcAnalyzer *this)

{
  bool bVar1;
  U64 UVar2;
  U64 UVar3;
  U8 UVar4;
  Frame frame;
  U64 local_50;
  U64 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined2 local_30;
  
  ByteAsyncReadByte_(__return_storage_ptr__,this);
  bVar1 = this->mReadingFrame;
  UVar4 = __return_storage_ptr__->value;
  if ((UVar4 == '~' & bVar1) == 1) {
    this->mFoundEndFlag = true;
  }
  else if ((UVar4 == '}' & bVar1) == 1) {
    UVar2 = __return_storage_ptr__->startSample;
    ByteAsyncReadByte_(__return_storage_ptr__,this);
    if (__return_storage_ptr__->value == '~') {
      UVar3 = __return_storage_ptr__->endSample;
      Frame::Frame((Frame *)&local_50);
      local_30 = 7;
      local_40 = 0;
      uStack_38 = 0;
      *(undefined8 *)&this->field_0xa8 = 0;
      *(undefined8 *)&this->field_0xb0 = 0;
      *(undefined2 *)&this->field_0xb8 = 7;
      *(U64 *)&this->mAbtFrame = UVar2;
      *(U64 *)&this->field_0xa0 = UVar3;
      local_50 = UVar2;
      local_48 = UVar3;
      Frame::~Frame((Frame *)&local_50);
      this->mAbortFrame = true;
    }
    else {
      UVar4 = HdlcAnalyzerSettings::Bit5Inv(__return_storage_ptr__->value);
      local_50 = CONCAT71(local_50._1_7_,UVar4);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&this->mCurrentFrameBytes,(value_type *)&local_50);
      __return_storage_ptr__->startSample = UVar2;
      __return_storage_ptr__->escaped = true;
    }
  }
  else if ((bVar1 & UVar4 != '~') == 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->mCurrentFrameBytes,&__return_storage_ptr__->value);
  }
  return __return_storage_ptr__;
}

Assistant:

HdlcByte HdlcAnalyzer::ByteAsyncReadByte()
{
    HdlcByte ret = ByteAsyncReadByte_();

    if( mReadingFrame && ( ret.value == HDLC_FLAG_VALUE ) )
    {
        mFoundEndFlag = true;
    }

    // Check for escape character
    if( mReadingFrame && ( ret.value == HDLC_ESCAPE_SEQ_VALUE ) ) // escape byte read
    {
        U64 startSampleEsc = ret.startSample;
        ret = ByteAsyncReadByte_();

        if( ret.value == HDLC_FLAG_VALUE ) // abort sequence = ESCAPE_BYTE + FLAG_BYTE (0x7D-0x7E)
        {
            // Create "Abort Frame" frame
            mAbtFrame = CreateFrame( HDLC_ABORT_SEQ, startSampleEsc, ret.endSample );
            mAbortFrame = true;
            return ret;
        }
        else
        {
            // Real data: with the bit-5 inverted (that's what we use for the crc)
            U8 complimented = HdlcAnalyzerSettings::Bit5Inv( ret.value );
            mCurrentFrameBytes.push_back( complimented );
            // ret.value = complimented;
            ret.startSample = startSampleEsc;
            ret.escaped = true;
            return ret;
        }
    }

    if( mReadingFrame && ( ret.value != HDLC_FLAG_VALUE ) )
    {
        mCurrentFrameBytes.push_back( ret.value );
    }

    return ret;
}